

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O2

void free_obj(OBJ_DATA *obj)

{
  OBJ_AFFECT_DATA *pOVar1;
  EXTRA_DESCR_DATA *pEVar2;
  OBJ_AFFECT_DATA *pOVar3;
  EXTRA_DESCR_DATA *ed;
  
  if ((obj != (OBJ_DATA *)0x0) && (obj->valid == true)) {
    pOVar1 = obj->affected;
    while (pOVar3 = pOVar1, pOVar3 != (OBJ_AFFECT_DATA *)0x0) {
      pOVar1 = pOVar3->next;
      if (pOVar3->valid == true) {
        pOVar3->valid = false;
        pOVar3->next = oaffect_free;
        oaffect_free = pOVar3;
      }
    }
    obj->affected = (OBJ_AFFECT_DATA *)0x0;
    ed = obj->extra_descr;
    while (ed != (EXTRA_DESCR_DATA *)0x0) {
      pEVar2 = ed->next;
      free_extra_descr(ed);
      ed = pEVar2;
    }
    obj->extra_descr = (EXTRA_DESCR_DATA *)0x0;
    free_pstring(obj->name);
    free_pstring(obj->description);
    free_pstring(obj->short_descr);
    obj->valid = false;
    obj->next = obj_free;
    obj_free = obj;
  }
  return;
}

Assistant:

void free_obj(OBJ_DATA *obj)
{
	OBJ_AFFECT_DATA *paf, *paf_next;
	EXTRA_DESCR_DATA *ed, *ed_next;

	if (!(obj != nullptr && obj->valid))
		return;

	for (paf = obj->affected; paf != nullptr; paf = paf_next)
	{
		paf_next = paf->next;
		free_affect_obj(paf);
	}

	obj->affected = nullptr;

	for (ed = obj->extra_descr; ed != nullptr; ed = ed_next)
	{
		ed_next = ed->next;
		free_extra_descr(ed);
	}

	obj->extra_descr = nullptr;

	free_pstring(obj->name);
	free_pstring(obj->description);
	free_pstring(obj->short_descr);

	// free_pstring( obj->owner     );
	obj->valid = false;
	obj->next = obj_free;
	obj_free = obj;
}